

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O3

string * tinyusdz::print_typed_attr<tinyusdz::value::color3f>
                   (string *__return_storage_ptr__,
                   TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::color3f>_> *attr
                   ,string *name,uint32_t indent)

{
  Animatable<tinyusdz::value::color3f> *v;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  Path *v_00;
  pprint *ppVar3;
  bool bVar4;
  bool bVar5;
  long lVar6;
  ostream *poVar7;
  uint32_t indent_00;
  undefined4 in_register_0000000c;
  pointer pPVar8;
  uint32_t n;
  uint32_t n_00;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t extraout_EDX_01;
  uint32_t n_01;
  byte bVar9;
  bool bVar10;
  stringstream ss;
  string local_210;
  pprint *local_1f0;
  string *local_1e8;
  string *local_1e0;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1f0 = (pprint *)CONCAT44(in_register_0000000c,indent);
  local_1e8 = name;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  bVar5 = (attr->_attrib).has_value_;
  bVar2 = attr->_empty;
  if (bVar2 == false) {
    if ((bVar5 & 1U) == 0) {
      lVar6 = 0x260;
      bVar9 = 1;
      if (((attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
           _M_impl.super__Vector_impl_data._M_finish ==
           (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
           _M_impl.super__Vector_impl_data._M_start) && (attr->_blocked == false))
      goto LAB_002df6b0;
    }
    else {
      lVar6 = 0x228;
      bVar9 = 0;
    }
  }
  else {
    lVar6 = 0x260;
    if ((bVar5 & 1U) != 0) {
      lVar6 = 0x228;
    }
    bVar9 = bVar5 ^ 1;
  }
  v = (Animatable<tinyusdz::value::color3f> *)(&(attr->_metas).interpolation.has_value_ + lVar6);
  pPVar8 = (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((*(char *)((long)&(attr->_metas).elementSize.contained + lVar6 + 1) == '\0') &&
     (v->_has_value == false)) {
    bVar5 = (v->_ts)._samples.
            super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::color3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::color3f>::Sample>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (v->_ts)._samples.
            super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::color3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::color3f>::Sample>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    bVar5 = false;
  }
  bVar10 = (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
           _M_impl.super__Vector_impl_data._M_finish == pPVar8;
  local_1e0 = __return_storage_ptr__;
  bVar4 = AttrMetas::authored(&attr->_metas);
  indent_00 = (uint32_t)pPVar8;
  n_01 = n;
  if (((!bVar10 | bVar5) & ~(bVar4 | (bVar9 | bVar2) & bVar10) & bVar2) == 0) {
    if (bVar2 == false) {
      pprint::Indent_abi_cxx11_(&local_210,local_1f0,n);
      ::std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
      paVar1 = &local_210.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != paVar1) {
        operator_delete(local_210._M_dataplus._M_p,
                        CONCAT44(local_210.field_2._M_allocated_capacity._4_4_,
                                 local_210.field_2._M_allocated_capacity._0_4_) + 1);
      }
      local_210.field_2._M_allocated_capacity._0_4_ = 0x6f6c6f63;
      local_210._M_string_length = 7;
      local_210.field_2._M_allocated_capacity._4_4_ = 0x663372;
      local_210._M_dataplus._M_p = (pointer)paVar1;
      poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,paVar1->_M_local_buf,7);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,(local_1e8->_M_dataplus)._M_p,local_1e8->_M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != paVar1) {
        operator_delete(local_210._M_dataplus._M_p,
                        CONCAT44(local_210.field_2._M_allocated_capacity._4_4_,
                                 local_210.field_2._M_allocated_capacity._0_4_) + 1);
      }
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," = ",3);
      print_animatable_default<tinyusdz::value::color3f>(&local_210,v,(uint32_t)local_1f0);
      ::std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
    }
    else {
      pprint::Indent_abi_cxx11_(&local_210,local_1f0,n);
      ::std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
      paVar1 = &local_210.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != paVar1) {
        operator_delete(local_210._M_dataplus._M_p,
                        CONCAT44(local_210.field_2._M_allocated_capacity._4_4_,
                                 local_210.field_2._M_allocated_capacity._0_4_) + 1);
      }
      local_210.field_2._M_allocated_capacity._0_4_ = 0x6f6c6f63;
      local_210._M_string_length = 7;
      local_210.field_2._M_allocated_capacity._4_4_ = 0x663372;
      local_210._M_dataplus._M_p = (pointer)paVar1;
      poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,paVar1->_M_local_buf,7);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,(local_1e8->_M_dataplus)._M_p,local_1e8->_M_string_length);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,
                      CONCAT44(local_210.field_2._M_allocated_capacity._4_4_,
                               local_210.field_2._M_allocated_capacity._0_4_) + 1);
    }
    bVar5 = AttrMetas::authored(&attr->_metas);
    if (bVar5) {
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," (\n",3);
      ppVar3 = local_1f0;
      print_attr_metas_abi_cxx11_
                (&local_210,(tinyusdz *)attr,(AttrMeta *)(ulong)((int)local_1f0 + 1),indent_00);
      poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
      pprint::Indent_abi_cxx11_(&local_1d8,(pprint *)((ulong)ppVar3 & 0xffffffff),n_00);
      poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,")",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p,
                        CONCAT44(local_210.field_2._M_allocated_capacity._4_4_,
                                 local_210.field_2._M_allocated_capacity._0_4_) + 1);
      }
    }
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
    n_01 = extraout_EDX;
  }
  __return_storage_ptr__ = local_1e0;
  if ((v->_ts)._dirty == true) {
    TypedTimeSamples<tinyusdz::value::color3f>::update(&v->_ts);
    n_01 = extraout_EDX_00;
  }
  if ((v->_ts)._samples.
      super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::color3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::color3f>::Sample>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (v->_ts)._samples.
      super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::color3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::color3f>::Sample>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    pprint::Indent_abi_cxx11_(&local_210,local_1f0,n_01);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
    paVar1 = &local_210.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != paVar1) {
      operator_delete(local_210._M_dataplus._M_p,
                      CONCAT44(local_210.field_2._M_allocated_capacity._4_4_,
                               local_210.field_2._M_allocated_capacity._0_4_) + 1);
    }
    local_210.field_2._M_allocated_capacity._0_4_ = 0x6f6c6f63;
    local_210._M_string_length = 7;
    local_210.field_2._M_allocated_capacity._4_4_ = 0x663372;
    local_210._M_dataplus._M_p = (pointer)paVar1;
    poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,paVar1->_M_local_buf,7);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,(local_1e8->_M_dataplus)._M_p,local_1e8->_M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != paVar1) {
      operator_delete(local_210._M_dataplus._M_p,
                      CONCAT44(local_210.field_2._M_allocated_capacity._4_4_,
                               local_210.field_2._M_allocated_capacity._0_4_) + 1);
    }
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,".timeSamples = ",0xf);
    print_animatable_timesamples<tinyusdz::value::color3f>(&local_210,v,(uint32_t)local_1f0);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != paVar1) {
      operator_delete(local_210._M_dataplus._M_p,
                      CONCAT44(local_210.field_2._M_allocated_capacity._4_4_,
                               local_210.field_2._M_allocated_capacity._0_4_) + 1);
    }
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
    n_01 = extraout_EDX_01;
  }
  if ((attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
      super__Vector_impl_data._M_start) {
    pprint::Indent_abi_cxx11_(&local_210,local_1f0,n_01);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
    paVar1 = &local_210.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != paVar1) {
      operator_delete(local_210._M_dataplus._M_p,
                      CONCAT44(local_210.field_2._M_allocated_capacity._4_4_,
                               local_210.field_2._M_allocated_capacity._0_4_) + 1);
    }
    local_210.field_2._M_allocated_capacity._0_4_ = 0x6f6c6f63;
    local_210._M_string_length = 7;
    local_210.field_2._M_allocated_capacity._4_4_ = 0x663372;
    local_210._M_dataplus._M_p = (pointer)paVar1;
    poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,paVar1->_M_local_buf,7);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,(local_1e8->_M_dataplus)._M_p,local_1e8->_M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != paVar1) {
      operator_delete(local_210._M_dataplus._M_p,
                      CONCAT44(local_210.field_2._M_allocated_capacity._4_4_,
                               local_210.field_2._M_allocated_capacity._0_4_) + 1);
    }
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,".connect = ",0xb);
    v_00 = (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
           _M_impl.super__Vector_impl_data._M_start;
    lVar6 = ((long)(attr->_paths).
                   super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)v_00 >> 4) * 0x4ec4ec4ec4ec4ec5;
    if (lVar6 == 0) {
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"[InternalError]",0xf);
    }
    else if (lVar6 == 1) {
      ::std::operator<<(local_1a8,v_00);
    }
    else {
      ::std::operator<<(local_1a8,&attr->_paths);
    }
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
  }
LAB_002df6b0:
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string print_typed_attr(
    const TypedAttributeWithFallback<Animatable<T>> &attr,
    const std::string &name, const uint32_t indent) {
  std::stringstream ss;

  if (attr.authored()) {

    const auto &v = attr.get_value();

    bool is_connection = attr.is_connection();
    bool is_timesamples = v.is_timesamples();
    bool has_value = attr.has_value();
    bool is_value_empty = attr.is_value_empty();

    DCOUT("name " << name);
    DCOUT("is_value_empty " << attr.is_value_empty());
    DCOUT("is_connection " << is_connection);
    DCOUT("is_timesamples " << is_timesamples);
    DCOUT("is_value_empty " << is_value_empty);
    DCOUT("has_value " << has_value);

    if (attr.metas().authored() || has_value || is_value_empty || ((!is_connection) && (!is_timesamples))) {
      if (has_value) {
        ss << pprint::Indent(indent);
        ss << value::TypeTraits<T>::type_name() << " " << name;
        ss << " = " << print_animatable_default(v, indent);

      } else { // attr.is_value_empty()
        // declare only
        ss << pprint::Indent(indent);
        ss << value::TypeTraits<T>::type_name() << " " << name;
      }

      if (attr.metas().authored()) {
        ss << " (\n"
           << print_attr_metas(attr.metas(), indent + 1) << pprint::Indent(indent)
           << ")";
      }
      ss << "\n";
    }

    if (v.has_timesamples()) {
      ss << pprint::Indent(indent);
      ss << value::TypeTraits<T>::type_name() << " " << name;
      ss << ".timeSamples = " << print_animatable_timesamples(v, indent);
      ss << "\n";
    }

    if (attr.has_connections()) {
      ss << pprint::Indent(indent);
      ss << value::TypeTraits<T>::type_name() << " " << name;
      ss << ".connect = ";

      const std::vector<Path> &paths = attr.get_connections();
      if (paths.size() == 1) {
        ss << paths[0];
      } else if (paths.size() == 0) {
        ss << "[InternalError]";
      } else {
        ss << paths;
      }

      ss << "\n";
    }

  }

  return ss.str();
}